

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

_Bool MatrixCompare(Matrix *a,Matrix *b)

{
  int iVar1;
  Matrix *b_local;
  Matrix *a_local;
  
  if ((a->rows == b->rows) && (a->columns == b->columns)) {
    iVar1 = memcmp(a->matrix,b->matrix,(ulong)a->rows * 0x10 * (ulong)a->columns);
    a_local._7_1_ = iVar1 == 0;
  }
  else {
    fprintf(_stderr,"%s: Invalid dimension (%dx%d == %dx%d)\n","MatrixCompare",(ulong)a->rows,
            (ulong)a->columns,(ulong)b->rows,b->columns);
    a_local._7_1_ = false;
  }
  return a_local._7_1_;
}

Assistant:

bool MatrixCompare(const Matrix *a, const Matrix *b) {
#ifndef NDEBUG
  if (a->rows != b->rows || a->columns != b->columns) {
    fprintf(stderr, "%s: Invalid dimension (%dx%d == %dx%d)\n", __FUNCTION_NAME__, a->rows, a->columns, b->rows, b->columns);
    return false;
  }
#endif
  return memcmp(a->matrix, b->matrix, sizeof(Real) * a->rows * a->columns) == 0 ? true : false;
}